

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::PushTextureID(ImDrawList *this,ImTextureID texture_id)

{
  ImTextureID local_18;
  
  local_18 = texture_id;
  ImVector<void_*>::push_back(&this->_TextureIdStack,&local_18);
  (this->_CmdHeader).TextureId = local_18;
  _OnChangedTextureID(this);
  return;
}

Assistant:

void ImDrawList::PushTextureID(ImTextureID texture_id)
{
    _TextureIdStack.push_back(texture_id);
    _CmdHeader.TextureId = texture_id;
    _OnChangedTextureID();
}